

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.cpp
# Opt level: O1

Symbol * __thiscall ScopeNode::resolve(ScopeNode *this,string *name)

{
  iterator iVar1;
  undefined8 *puVar2;
  
  do {
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>_>_>
                    *)this,name);
    if ((_Rb_tree_header *)iVar1._M_node != &(this->symbols_)._M_t._M_impl.super__Rb_tree_header) {
      return (Symbol *)(iVar1._M_node + 2);
    }
    this = this->enclosing_scope_;
  } while (this != (ScopeNode *)0x0);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00153cb8;
  __cxa_throw(puVar2,&scope_not_found::typeinfo,std::exception::~exception);
}

Assistant:

Symbol &ScopeNode::resolve(const std::string &name) {
    std::map<std::string, Symbol>::iterator it = symbols_.find(name);
    if (it != symbols_.end()) {
        return it->second;
    } else {
        ScopeNode *enclosing_scope = get_enclosing_scope();
        if (enclosing_scope) {
            return enclosing_scope->resolve(name);
        } else {
            throw scope_not_found();
        }
    }
}